

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckInternalVariables.cxx
# Opt level: O3

string * __thiscall
kws::Parser::FindInternalVariable_abi_cxx11_
          (string *__return_storage_ptr__,Parser *this,size_t start,size_t end,size_t *pos)

{
  string *psVar1;
  long lVar2;
  byte bVar3;
  char cVar4;
  bool bVar5;
  byte bVar6;
  ulong pos_00;
  pointer pcVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  bool bVar11;
  string subphrase;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_t *local_68;
  Parser *local_60;
  size_t local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  psVar1 = &this->m_BufferNoComment;
  local_68 = pos;
  local_60 = this;
  local_58 = end;
  pos_00 = std::__cxx11::string::find((char *)psVar1,0x175d46,start);
  local_70 = &__return_storage_ptr__->field_2;
  while( true ) {
    if (local_58 <= pos_00) {
      *local_68 = 0xffffffffffffffff;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    if (pos_00 != 0) break;
    *local_68 = 0;
    pcVar7 = (psVar1->_M_dataplus)._M_p;
LAB_001520a8:
    sVar10 = 0xffffffffffffffff;
LAB_001520af:
    if (pcVar7[sVar10] == '}') {
      sVar10 = FindOpeningChar(local_60,'}','{',sVar10,true);
      if (sVar10 != 0) {
        do {
          if ((psVar1->_M_dataplus)._M_p[sVar10] == ';') break;
          sVar10 = sVar10 - 1;
        } while (sVar10 != 0);
      }
      std::__cxx11::string::substr((ulong)local_90,(ulong)psVar1);
      lVar9 = std::__cxx11::string::find((char *)local_90,0x176508,0);
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
      bVar11 = true;
      if (lVar9 == -1) {
        std::__cxx11::string::substr((ulong)local_90,(ulong)psVar1);
        lVar9 = std::__cxx11::string::find((char *)local_90,0x1763fb,0);
        bVar11 = lVar9 != -1;
        if (local_90[0] != local_80) {
          operator_delete(local_90[0]);
        }
      }
    }
    else {
      bVar11 = false;
    }
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"");
    std::__cxx11::string::substr((ulong)local_50,(ulong)psVar1);
    std::__cxx11::string::operator=((string *)local_90,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    lVar9 = std::__cxx11::string::find((char *)local_90,0x176aa9,0);
    if (((((((lVar9 != -1) ||
            (lVar9 = std::__cxx11::string::find((char *)local_90,0x175d52,0), lVar9 != -1)) ||
           (lVar9 = std::__cxx11::string::find((char *)local_90,0x1763fb,0), lVar9 != -1)) ||
          ((lVar9 = std::__cxx11::string::find((char *)local_90,0x16d6f2,0), lVar9 != -1 ||
           (lVar9 = std::__cxx11::string::find((char *)local_90,0x1767ec,0), lVar9 != -1)))) ||
         ((lVar9 = std::__cxx11::string::find((char *)local_90,0x176916,0), lVar9 != -1 ||
          ((lVar9 = std::__cxx11::string::find((char *)local_90,0x176512,0), lVar9 != -1 ||
           (lVar9 = std::__cxx11::string::find((char *)local_90,0x1767f3,0), lVar9 != -1)))))) ||
        (lVar9 = std::__cxx11::string::find((char *)local_90,0x1776eb,0), lVar9 != -1)) ||
       ((lVar9 = std::__cxx11::string::find((char *)local_90,0x176487,0), bVar11 || lVar9 != -1 ||
        (bVar11 = IsInFunction(local_60,pos_00,(char *)0x0), bVar11)))) {
      pos_00 = std::__cxx11::string::find((char *)psVar1,0x175d46,pos_00 + 1);
      bVar5 = true;
      bVar11 = false;
    }
    else {
      lVar9 = std::__cxx11::string::find_last_of
                        ((char *)__return_storage_ptr__,0x1685ee,0xffffffffffffffff);
      bVar11 = true;
      if (lVar9 != -1) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
      bVar5 = false;
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
    if ((!bVar11) &&
       (pcVar7 = (__return_storage_ptr__->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar7 != local_70)) {
      operator_delete(pcVar7);
    }
    if (!bVar5) {
      return __return_storage_ptr__;
    }
  }
  lVar8 = 2;
  lVar9 = -1;
  bVar6 = 0;
LAB_00151f79:
  lVar2 = pos_00 + lVar9;
  bVar3 = (psVar1->_M_dataplus)._M_p[lVar2];
  if (bVar3 < 0x20) {
    if (bVar3 != 9) {
      if (bVar3 == 10) goto LAB_00152062;
      goto LAB_00151fcb;
    }
LAB_00151f9c:
    bVar11 = (bool)(bVar6 ^ 1);
    goto LAB_0015203b;
  }
  if (bVar3 < 0x29) {
    if (bVar3 == 0x20) goto LAB_00151f9c;
  }
  else if (((bVar3 == 0x29) || (bVar3 == 0x5d)) || (bVar3 == 0x7d)) {
LAB_00152062:
    lVar9 = -lVar8;
LAB_00152068:
    sVar10 = lVar9 + pos_00;
    *local_68 = pos_00;
    pcVar7 = (psVar1->_M_dataplus)._M_p;
    if (sVar10 != 0xffffffffffffffff) {
      do {
        cVar4 = pcVar7[sVar10];
        if (cVar4 == ':') {
          if ((pcVar7[sVar10 - 1] != ':') && (pcVar7[sVar10 + 1] != ':')) goto LAB_001520af;
        }
        else if ((cVar4 == ';') || (cVar4 == '}')) goto LAB_001520af;
        bVar11 = sVar10 != 0;
        sVar10 = sVar10 - 1;
      } while (bVar11);
    }
    goto LAB_001520a8;
  }
LAB_00151fcb:
  local_90[0] = local_80;
  pcVar7 = (__return_storage_ptr__->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar7,pcVar7 + __return_storage_ptr__->_M_string_length);
  std::__cxx11::string::_M_replace_aux
            ((ulong)__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,'\x01');
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90[0]);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  bVar11 = true;
  bVar6 = 1;
LAB_0015203b:
  lVar9 = lVar9 + -1;
  if ((lVar2 == 0) || (lVar8 = lVar8 + 1, !bVar11)) goto LAB_00152068;
  goto LAB_00151f79;
}

Assistant:

std::string Parser::FindInternalVariable(size_t start, size_t end,size_t & pos)
{
  size_t posSemicolon = m_BufferNoComment.find(";",start);
  while(posSemicolon != std::string::npos && posSemicolon<end)
    {
    // We try to find the word before that
    unsigned long i=static_cast<unsigned long>(posSemicolon)-1;
    bool inWord = true;
    bool first = false;
    std::string ivar = "";
    while(i != std::string::npos && inWord)
      {
      if((m_BufferNoComment[i] != ' ')
         && (m_BufferNoComment[i] != '\t')
        )
        {
        if((m_BufferNoComment[i] == '}')
          || (m_BufferNoComment[i] == ')')
          || (m_BufferNoComment[i] == ']')
          || (m_BufferNoComment[i] == '\n')
          )
          {
          inWord = false;
          }
        else
          {
          std::string store = ivar;
          ivar = m_BufferNoComment[i];
          ivar += store;
          inWord = true;
          first = true;
          }
        }
      else // we have a space
        {
        if(first)
          {
          inWord = false;
          }
        }
      i--;
      }
    pos = posSemicolon;
    // We extract the complete definition.
    // This means that we look for a '{' or '}' or '{' or ':'
    // but not '::'
    while(i != std::string::npos)
      {
      if(m_BufferNoComment[i] == ';'
        || m_BufferNoComment[i] == '}'
        )
        {
        break;
        }
      else if(m_BufferNoComment[i] == ':')
        {
        if((m_BufferNoComment[i-1] != ':') && (m_BufferNoComment[i+1] != ':'))
          {
          break;
          }
        }
      i--;
      }

    bool isenum = false;
    // If we have a '}' we check that this is not an enum definition
    // or a typedef
    if(m_BufferNoComment[i] == '}')
      {

      // Find the opening char
      size_t j = this->FindOpeningChar('}','{',i,true);
      // Find a semicolon before that
      while(j>0)
        {
        if(m_BufferNoComment[j] == ';')
          {
          break;
          }
        j--;
        }

      if(m_BufferNoComment.substr(j+1,i-j-1).find("enum") != std::string::npos)
        {
        isenum = true;
        }
      else if(m_BufferNoComment.substr(j+1,i-j-1).find("typedef") != std::string::npos)
        {
        isenum = true;
        }
     }

    std::string subphrase = "";
    subphrase = m_BufferNoComment.substr(i+1,posSemicolon-i-1);

    if( (subphrase.find("=") == std::string::npos)
      && (subphrase.find("(") == std::string::npos)
      && (subphrase.find("typedef") == std::string::npos)
      && (subphrase.find("}") == std::string::npos)
      && (subphrase.find("friend") == std::string::npos)
      && (subphrase.find("class") == std::string::npos)
      && (subphrase.find("return") == std::string::npos)
      && (subphrase.find("extern") == std::string::npos)
      && (subphrase.find("\"") == std::string::npos)
      && (subphrase.find("<<") == std::string::npos)
      && !isenum
      )
      {
      // Check that we are not inside a function(){}
      if(!this->IsInFunction(posSemicolon))
        {
        // We check if any * is present and strip
        // the work
        size_t posstar = ivar.find_last_of("*");
        if(posstar != std::string::npos)
          {
          ivar = ivar.substr(posstar+1,ivar.size()-posstar-1);
          }
        return ivar;
        }
      }
    posSemicolon = m_BufferNoComment.find(";",posSemicolon+1);
    }

  pos = std::string::npos;
  return "";
}